

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_backend.c
# Opt level: O0

RSA * ossl_rsa_key_from_pkcs8(PKCS8_PRIV_KEY_INFO *p8inf,OSSL_LIB_CTX *libctx,char *propq)

{
  int iVar1;
  PKCS8_PRIV_KEY_INFO *in_RDI;
  X509_ALGOR *alg;
  int pklen;
  RSA *rsa;
  uchar *p;
  X509_ALGOR *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  RSA *in_stack_ffffffffffffffd8;
  RSA *local_8;
  
  iVar1 = PKCS8_pkey_get0((ASN1_OBJECT **)0x0,(uchar **)&stack0xffffffffffffffd8,
                          (int *)&stack0xffffffffffffffcc,(X509_ALGOR **)&stack0xffffffffffffffc0,
                          in_RDI);
  if (iVar1 == 0) {
    local_8 = (RSA *)0x0;
  }
  else {
    local_8 = (RSA *)d2i_RSAPrivateKey((RSA **)0x0,(uchar **)&stack0xffffffffffffffd8,
                                       (long)in_stack_ffffffffffffffcc);
    if (local_8 == (RSA *)0x0) {
      ERR_new();
      ERR_set_debug((char *)local_8,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0);
      ERR_set_error(4,0x80004,(char *)0x0);
      local_8 = (RSA *)0x0;
    }
    else {
      iVar1 = ossl_rsa_param_decode(in_stack_ffffffffffffffd8,(X509_ALGOR *)local_8);
      if (iVar1 == 0) {
        RSA_free((RSA *)local_8);
        local_8 = (RSA *)0x0;
      }
      else {
        RSA_clear_flags(local_8,0xf000);
        iVar1 = OBJ_obj2nid(in_stack_ffffffffffffffc0->algorithm);
        if (iVar1 == 6) {
          RSA_set_flags(local_8,0);
        }
        else if (iVar1 == 0x390) {
          RSA_set_flags(local_8,0x1000);
        }
      }
    }
  }
  return local_8;
}

Assistant:

RSA *ossl_rsa_key_from_pkcs8(const PKCS8_PRIV_KEY_INFO *p8inf,
                             OSSL_LIB_CTX *libctx, const char *propq)
{
    const unsigned char *p;
    RSA *rsa;
    int pklen;
    const X509_ALGOR *alg;

    if (!PKCS8_pkey_get0(NULL, &p, &pklen, &alg, p8inf))
        return 0;
    rsa = d2i_RSAPrivateKey(NULL, &p, pklen);
    if (rsa == NULL) {
        ERR_raise(ERR_LIB_RSA, ERR_R_RSA_LIB);
        return NULL;
    }
    if (!ossl_rsa_param_decode(rsa, alg)) {
        RSA_free(rsa);
        return NULL;
    }

    RSA_clear_flags(rsa, RSA_FLAG_TYPE_MASK);
    switch (OBJ_obj2nid(alg->algorithm)) {
    case EVP_PKEY_RSA:
        RSA_set_flags(rsa, RSA_FLAG_TYPE_RSA);
        break;
    case EVP_PKEY_RSA_PSS:
        RSA_set_flags(rsa, RSA_FLAG_TYPE_RSASSAPSS);
        break;
    default:
        /* Leave the type bits zero */
        break;
    }

    return rsa;
}